

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O1

tree_node * __thiscall RegexTree::copy_tree(RegexTree *this,tree_node *src)

{
  tree_node *ptVar1;
  tree_node *ptVar2;
  
  if (src == (tree_node *)0x0) {
    ptVar1 = (tree_node *)0x0;
  }
  else {
    ptVar1 = (tree_node *)operator_new(0x18);
    ptVar1->left = (tree_node *)0x0;
    ptVar1->right = (tree_node *)0x0;
    ptVar1->c = '\0';
    ptVar1->c = src->c;
    ptVar2 = copy_tree(this,src->left);
    ptVar1->left = ptVar2;
    ptVar2 = copy_tree(this,src->right);
    ptVar1->right = ptVar2;
  }
  return ptVar1;
}

Assistant:

tree_node *RegexTree::copy_tree(tree_node *src) {
    if (src == nullptr) return nullptr;
    tree_node *ret = new tree_node;
    ret->c = src->c;
    ret->left = copy_tree(src->left);
    ret->right = copy_tree(src->right);
    return ret;
}